

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O3

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::extract_bvh
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,size_t root_id)

{
  pointer *ppNVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  pointer pNVar5;
  pointer pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  unsigned_long uVar10;
  iterator iVar11;
  unsigned_long *__first;
  unsigned_long uVar12;
  stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  stack;
  undefined8 local_b0;
  uint local_a4;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_a0;
  back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_98;
  size_t local_90;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_88;
  
  local_90 = root_id;
  if (root_id != 0) {
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ::_M_realloc_insert<>(&__return_storage_ptr__->nodes,(iterator)0x0);
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::_M_initialize_map(&local_88,0);
    local_b0 = (ulong)local_b0._4_4_ << 0x20;
    std::
    deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long&,int>
              ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&local_88,&local_90,(int *)&local_b0);
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_98.container = &__return_storage_ptr__->prim_ids;
      local_a0 = this;
      do {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          uVar10 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first;
          uVar12 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second;
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          uVar10 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first;
          uVar12 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        pNVar5 = (__return_storage_ptr__->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar6 = (this->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = *(undefined8 *)pNVar6[uVar10].bounds._M_elems;
        uVar8 = *(undefined8 *)((long)pNVar6[uVar10].bounds._M_elems + 8);
        pfVar2 = (float *)((long)pNVar6[uVar10].bounds._M_elems + 0xc);
        uVar9 = *(undefined8 *)(pfVar2 + 2);
        pfVar3 = (float *)((long)pNVar5[uVar12].bounds._M_elems + 0xc);
        *(undefined8 *)pfVar3 = *(undefined8 *)pfVar2;
        *(undefined8 *)(pfVar3 + 2) = uVar9;
        *(undefined8 *)pNVar5[uVar12].bounds._M_elems = uVar7;
        *(undefined8 *)((long)pNVar5[uVar12].bounds._M_elems + 8) = uVar8;
        if ((pNVar6[uVar10].index.value & 0xf) == 0) {
          Index<32UL,_4UL>::Index
                    ((Index<32UL,_4UL> *)&local_b0,
                     ((long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7,
                     (ulong)(pNVar5[uVar12].index.value & 0xf));
          pNVar5[uVar12].index.value = local_b0._0_4_;
          local_a4 = pNVar6[uVar10].index.value >> 4;
          local_b0 = ((long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
          std::
          deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<unsigned_int,unsigned_long>
                    ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)&local_88,&local_a4,(unsigned_long *)&local_b0);
          local_a4 = (pNVar6[uVar10].index.value >> 4) + 1;
          local_b0 = ((long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7 + 1
          ;
          std::
          deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<unsigned_int,unsigned_long>
                    ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)&local_88,&local_a4,(unsigned_long *)&local_b0);
          this = local_a0;
          iVar11._M_current =
               (__return_storage_ptr__->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (__return_storage_ptr__->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ::_M_realloc_insert<>(&__return_storage_ptr__->nodes,iVar11);
            iVar11._M_current =
                 (__return_storage_ptr__->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            ((iVar11._M_current)->bounds)._M_elems[3] = 0.0;
            ((iVar11._M_current)->bounds)._M_elems[4] = 0.0;
            *(undefined8 *)(((iVar11._M_current)->bounds)._M_elems + 5) = 0;
            ((iVar11._M_current)->bounds)._M_elems[0] = 0.0;
            ((iVar11._M_current)->bounds)._M_elems[1] = 0.0;
            ((iVar11._M_current)->bounds)._M_elems[2] = 0.0;
            ((iVar11._M_current)->bounds)._M_elems[3] = 0.0;
            iVar11._M_current =
                 (__return_storage_ptr__->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar11._M_current;
          }
          if (iVar11._M_current ==
              (__return_storage_ptr__->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ::_M_realloc_insert<>(&__return_storage_ptr__->nodes,iVar11);
          }
          else {
            ((iVar11._M_current)->bounds)._M_elems[3] = 0.0;
            ((iVar11._M_current)->bounds)._M_elems[4] = 0.0;
            *(undefined8 *)(((iVar11._M_current)->bounds)._M_elems + 5) = 0;
            ((iVar11._M_current)->bounds)._M_elems[0] = 0.0;
            ((iVar11._M_current)->bounds)._M_elems[1] = 0.0;
            ((iVar11._M_current)->bounds)._M_elems[2] = 0.0;
            ((iVar11._M_current)->bounds)._M_elems[3] = 0.0;
            ppNVar1 = &(__return_storage_ptr__->nodes).
                       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppNVar1 = *ppNVar1 + 1;
          }
        }
        else {
          Index<32UL,_4UL>::Index
                    ((Index<32UL,_4UL> *)&local_b0,
                     (long)(__return_storage_ptr__->prim_ids).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->prim_ids).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3,
                     (ulong)(pNVar5[uVar12].index.value & 0xf));
          pNVar5[uVar12].index.value = local_b0._0_4_;
          uVar4 = pNVar6[uVar10].index.value;
          if ((uVar4 & 0xf) != 0) {
            __first = (this->prim_ids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + (uVar4 >> 4);
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<unsigned_long_const*,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (__first,__first + ((ulong)uVar4 & 0xf),local_98);
          }
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base(&local_88);
    return __return_storage_ptr__;
  }
  __assert_fail("root_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/bvh.h"
                ,0x5d,
                "Bvh<Node> bvh::v2::Bvh<bvh::v2::Node<float, 3>>::extract_bvh(size_t) const [Node = bvh::v2::Node<float, 3>]"
               );
}

Assistant:

Bvh<Node> Bvh<Node>::extract_bvh(size_t root_id) const {
    assert(root_id != 0);

    Bvh bvh;
    bvh.nodes.emplace_back();

    std::stack<std::pair<size_t, size_t>> stack;
    stack.emplace(root_id, 0);
    while (!stack.empty()) {
        auto [src_id, dst_id] = stack.top();
        stack.pop();
        const auto& src_node = nodes[src_id];
        auto& dst_node = bvh.nodes[dst_id];
        dst_node = src_node;
        if (src_node.is_leaf()) {
            dst_node.index.set_first_id(bvh.prim_ids.size());
            std::copy_n(
                prim_ids.begin() + src_node.index.first_id(),
                src_node.index.prim_count(),
                std::back_inserter(bvh.prim_ids));
        } else {
            dst_node.index.set_first_id(bvh.nodes.size());
            stack.emplace(src_node.index.first_id() + 0, bvh.nodes.size() + 0);
            stack.emplace(src_node.index.first_id() + 1, bvh.nodes.size() + 1);
            // Note: This may invalidate `dst_node` so has to happen after any access to it.
            bvh.nodes.emplace_back();
            bvh.nodes.emplace_back();
        }
    }
    return bvh;
}